

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++:871:31)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_c__:871:31)>
      *this)

{
  ExceptionOr<kj::_::PromiseBase> *pEVar1;
  PromiseNode *pPVar2;
  Disposer *pDVar3;
  
  pEVar1 = (this->func).intermediate;
  if ((pEVar1->value).ptr.isSet == true) {
    (pEVar1->value).ptr.isSet = false;
    pPVar2 = (pEVar1->value).ptr.field_1.value.node.ptr;
    if (pPVar2 != (PromiseNode *)0x0) {
      (pEVar1->value).ptr.field_1.value.node.ptr = (PromiseNode *)0x0;
      pDVar3 = (pEVar1->value).ptr.field_1.value.node.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
      return;
    }
  }
  return;
}

Assistant:

void run() override {
    func();
  }